

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

VkImageViewType vkt::sparse::mapImageViewType(ImageType imageType)

{
  VkImageViewType local_c;
  ImageType imageType_local;
  
  switch(imageType) {
  case IMAGE_TYPE_1D:
    local_c = VK_IMAGE_VIEW_TYPE_1D;
    break;
  case IMAGE_TYPE_1D_ARRAY:
    local_c = VK_IMAGE_VIEW_TYPE_1D_ARRAY;
    break;
  case IMAGE_TYPE_2D:
    local_c = VK_IMAGE_VIEW_TYPE_2D;
    break;
  case IMAGE_TYPE_2D_ARRAY:
    local_c = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
    break;
  case IMAGE_TYPE_3D:
    local_c = VK_IMAGE_VIEW_TYPE_3D;
    break;
  case IMAGE_TYPE_CUBE:
    local_c = VK_IMAGE_VIEW_TYPE_CUBE;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    local_c = VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
    break;
  default:
    local_c = VK_IMAGE_VIEW_TYPE_LAST;
  }
  return local_c;
}

Assistant:

VkImageViewType	mapImageViewType (const ImageType imageType)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:			return VK_IMAGE_VIEW_TYPE_1D;
		case IMAGE_TYPE_1D_ARRAY:	return VK_IMAGE_VIEW_TYPE_1D_ARRAY;
		case IMAGE_TYPE_2D:			return VK_IMAGE_VIEW_TYPE_2D;
		case IMAGE_TYPE_2D_ARRAY:	return VK_IMAGE_VIEW_TYPE_2D_ARRAY;
		case IMAGE_TYPE_3D:			return VK_IMAGE_VIEW_TYPE_3D;
		case IMAGE_TYPE_CUBE:		return VK_IMAGE_VIEW_TYPE_CUBE;
		case IMAGE_TYPE_CUBE_ARRAY:	return VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;

		default:
			DE_ASSERT(false);
			return VK_IMAGE_VIEW_TYPE_LAST;
	}
}